

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O0

void auto_compaction_with_custom_cmp_function(void)

{
  fdb_status fVar1;
  fdb_file_info *info;
  fdb_custom_cmp_variable functions [1];
  char *kvs_names [1];
  fdb_file_info file_info;
  fdb_kvs_config kvs_config;
  fdb_config config;
  fdb_status status;
  fdb_kvs_handle *db3;
  fdb_kvs_handle *db2;
  fdb_kvs_handle *db1;
  fdb_file_handle *file;
  uint64_t max_filesize;
  char bodybuf [256];
  char keybuf [256];
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_file_handle *fhandle;
  fdb_file_handle *in_stack_fffffffffffffa70;
  size_t in_stack_fffffffffffffa88;
  fdb_kvs_handle *valuelen;
  void *in_stack_fffffffffffffa90;
  size_t in_stack_fffffffffffffa98;
  fdb_encryption_key *keylen;
  void *in_stack_fffffffffffffaa0;
  fdb_kvs_handle *in_stack_fffffffffffffaa8;
  fdb_kvs_handle *handle;
  undefined1 local_4f8 [248];
  code *local_400;
  undefined1 local_3f8 [8];
  fdb_kvs_config *in_stack_fffffffffffffc10;
  char *in_stack_fffffffffffffc18;
  fdb_kvs_handle **in_stack_fffffffffffffc20;
  fdb_file_handle *in_stack_fffffffffffffc28;
  ulong local_3c8;
  undefined1 local_390 [16];
  char **in_stack_fffffffffffffc88;
  size_t in_stack_fffffffffffffc90;
  undefined6 in_stack_fffffffffffffc98;
  char *in_stack_fffffffffffffca0;
  void **in_stack_fffffffffffffcc0;
  void *local_290;
  ulong local_270;
  fdb_kvs_handle local_268;
  int local_5c;
  int local_58;
  uint local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  memleak_start();
  local_5c = 10000;
  local_270 = 0;
  memset(local_3f8,0,8);
  local_400 = _compact_test_keycmp;
  local_58 = system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  memcpy(local_390,local_4f8,0xf8);
  fhandle = (fdb_file_handle *)0x0;
  fVar1 = fdb_open_custom_cmp((fdb_file_handle **)0x1,in_stack_fffffffffffffca0,
                              (fdb_config *)CONCAT17(10,CONCAT16(1,in_stack_fffffffffffffc98)),
                              in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                              (fdb_custom_cmp_variable *)0x1000,in_stack_fffffffffffffcc0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x7da);
    auto_compaction_with_custom_cmp_function::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x7da,"void auto_compaction_with_custom_cmp_function()");
    }
  }
  fdb_get_default_kvs_config();
  fVar1 = fdb_kvs_open_default(in_stack_fffffffffffffa70,&fhandle->root,(fdb_kvs_config *)0x10ea7a);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x7df);
    auto_compaction_with_custom_cmp_function::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x7df,"void auto_compaction_with_custom_cmp_function()");
    }
  }
  fVar1 = fdb_kvs_open(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18
                       ,in_stack_fffffffffffffc10);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x7e1);
    auto_compaction_with_custom_cmp_function::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x7e1,"void auto_compaction_with_custom_cmp_function()");
    }
  }
  local_54 = 0;
  do {
    if (local_5c <= (int)local_54) {
      fVar1 = fdb_kvs_open(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
                           in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x7f3);
        auto_compaction_with_custom_cmp_function::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x7f3,"void auto_compaction_with_custom_cmp_function()");
        }
      }
      local_54 = 0;
      sprintf((char *)&local_268.config.encryption_key,"key%06d",0);
      sprintf((char *)&local_268,"body%06d",(ulong)local_54);
      keylen = &local_268.config.encryption_key;
      info = (fdb_file_info *)strlen((char *)&local_268.config.encryption_key);
      handle = &local_268;
      strlen((char *)&local_268);
      fVar1 = fdb_set_kv(handle,info,(size_t)keylen,local_290,in_stack_fffffffffffffa88);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x7f9);
        auto_compaction_with_custom_cmp_function::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x7f9,"void auto_compaction_with_custom_cmp_function()");
        }
      }
      fVar1 = fdb_commit(fhandle,'\0');
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x7fd);
        auto_compaction_with_custom_cmp_function::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x7fd,"void auto_compaction_with_custom_cmp_function()");
        }
      }
      local_54 = 0;
      do {
        if (local_5c <= (int)local_54) {
          fVar1 = fdb_commit(fhandle,'\0');
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x80f);
            auto_compaction_with_custom_cmp_function::__test_pass = 0;
            if (fVar1 != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                            ,0x80f,"void auto_compaction_with_custom_cmp_function()");
            }
          }
          fVar1 = fdb_get_file_info((fdb_file_handle *)handle,info);
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x812);
            auto_compaction_with_custom_cmp_function::__test_pass = 0;
            if (fVar1 != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                            ,0x812,"void auto_compaction_with_custom_cmp_function()");
            }
          }
          if (local_270 < local_3c8) {
            local_270 = local_3c8;
          }
          printf("wait for daemon compaction completion... (max file size: %lu)\n",local_270);
          do {
            sleep(1);
            fVar1 = fdb_get_file_info((fdb_file_handle *)handle,info);
            if (fVar1 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x81c);
              auto_compaction_with_custom_cmp_function::__test_pass = 0;
              if (fVar1 != FDB_RESULT_SUCCESS) {
                __assert_fail("status == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                              ,0x81c,"void auto_compaction_with_custom_cmp_function()");
              }
            }
          } while (local_270 <= local_3c8);
          if (local_270 <= local_3c8) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x822);
            auto_compaction_with_custom_cmp_function::__test_pass = 0;
            if (local_270 <= local_3c8) {
              __assert_fail("file_info.file_size < max_filesize",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                            ,0x822,"void auto_compaction_with_custom_cmp_function()");
            }
          }
          fVar1 = fdb_close(fhandle);
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x825);
            auto_compaction_with_custom_cmp_function::__test_pass = 0;
            if (fVar1 != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                            ,0x825,"void auto_compaction_with_custom_cmp_function()");
            }
          }
          fVar1 = fdb_shutdown();
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x827);
            auto_compaction_with_custom_cmp_function::__test_pass = 0;
            if (fVar1 != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                            ,0x827,"void auto_compaction_with_custom_cmp_function()");
            }
          }
          memleak_end();
          if (auto_compaction_with_custom_cmp_function::__test_pass == 0) {
            fprintf(_stderr,"%s FAILED\n","auto compaction with custom comparison function");
          }
          else {
            fprintf(_stderr,"%s PASSED\n","auto compaction with custom comparison function");
          }
          return;
        }
        sprintf((char *)&local_268.config.encryption_key,"key%06d",(ulong)local_54);
        sprintf((char *)&local_268,"body%06d",(ulong)local_54);
        strlen((char *)&local_268.config.encryption_key);
        valuelen = &local_268;
        strlen((char *)&local_268);
        fVar1 = fdb_set_kv(handle,info,(size_t)keylen,local_290,(size_t)valuelen);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x805);
          auto_compaction_with_custom_cmp_function::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0x805,"void auto_compaction_with_custom_cmp_function()");
          }
        }
        fVar1 = fdb_get_file_info((fdb_file_handle *)handle,info);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x808);
          auto_compaction_with_custom_cmp_function::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0x808,"void auto_compaction_with_custom_cmp_function()");
          }
        }
        if (local_270 < local_3c8) {
          local_270 = local_3c8;
        }
        local_54 = local_54 + 1;
      } while( true );
    }
    sprintf((char *)&local_268.config.encryption_key,"key%06d",(ulong)local_54);
    sprintf((char *)&local_268,"body%06d",(ulong)local_54);
    strlen((char *)&local_268.config.encryption_key);
    strlen((char *)&local_268);
    fVar1 = fdb_set_kv(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98
                       ,in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x7e9);
      auto_compaction_with_custom_cmp_function::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x7e9,"void auto_compaction_with_custom_cmp_function()");
      }
    }
    strlen((char *)&local_268.config.encryption_key);
    strlen((char *)&local_268);
    fVar1 = fdb_set_kv(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98
                       ,in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x7ec);
      auto_compaction_with_custom_cmp_function::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x7ec,"void auto_compaction_with_custom_cmp_function()");
      }
    }
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

void auto_compaction_with_custom_cmp_function()
{
    TEST_INIT();

    memleak_start();

    int i, r, n=10000;
    char keybuf[256], bodybuf[256];
    uint64_t max_filesize = 0;
    fdb_file_handle *file;
    fdb_kvs_handle *db1, *db2, *db3;
    fdb_status status;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_file_info file_info;
    char *kvs_names[] = {NULL};
    fdb_custom_cmp_variable functions[] = {_compact_test_keycmp};

    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    // Open Database File
    config = fdb_get_default_config();
    config.wal_threshold = 4096; // reset WAL threshold for correct file size estimation
    config.compaction_mode=FDB_COMPACTION_AUTO;
    config.compactor_sleep_duration = 1;
    config.compaction_threshold = 10;
    status = fdb_open_custom_cmp(&file, "compact_test", &config,
                                 1, kvs_names, functions, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Open 2 KV Stores
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_kvs_open_default(file, &db1, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open(file, &db2, "db", &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // initial load
    for(i=0;i<n;i++) {
        sprintf(keybuf, "key%06d", i);
        sprintf(bodybuf, "body%06d", i);
        status = fdb_set_kv(db1, keybuf, strlen(keybuf),
                                 bodybuf, strlen(bodybuf));
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_set_kv(db2, keybuf, strlen(keybuf),
                                 bodybuf, strlen(bodybuf));
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // create one more KVS using custom cmp
    // it doesn't exist on the initial cmp_func list
    kvs_config.custom_cmp = _compact_test_keycmp;
    status = fdb_kvs_open(file, &db3, "db_custom", &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    i = 0;
    sprintf(keybuf, "key%06d", i);
    sprintf(bodybuf, "body%06d", i);
    status = fdb_set_kv(db3, keybuf, strlen(keybuf),
                             bodybuf, strlen(bodybuf));
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Commit
    status = fdb_commit(file, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // update to trigger compaction
    for(i=0;i<n;i++) {
        sprintf(keybuf, "key%06d", i);
        sprintf(bodybuf, "body%06d", i);
        status = fdb_set_kv(db1, keybuf, strlen(keybuf),
                                 bodybuf, strlen(bodybuf));
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        status = fdb_get_file_info(file, &file_info);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if (file_info.file_size > max_filesize) {
            max_filesize = file_info.file_size;
        }
    }
    // Commit
    status = fdb_commit(file, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get_file_info(file, &file_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    if (file_info.file_size > max_filesize) {
        max_filesize = file_info.file_size;
    }

    printf("wait for daemon compaction completion... (max file size: %" _F64 ")\n", max_filesize);
    while (true) {
        sleep(1);

        status = fdb_get_file_info(file, &file_info);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if (file_info.file_size < max_filesize) {
            break;
        }
    }
    // should be compacted
    TEST_CHK(file_info.file_size < max_filesize);

    status = fdb_close(file);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_shutdown();
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    memleak_end();

    TEST_RESULT("auto compaction with custom comparison function");
}